

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O2

void setupAlphaTable(void)

{
  long lVar1;
  int i;
  long lVar2;
  int (*paiVar3) [8];
  int j;
  ulong uVar4;
  int j_1;
  
  if (alphaTableInitialized == 0) {
    alphaTableInitialized = 1;
    lVar1 = 0x360110;
    for (lVar2 = 0x10; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      for (uVar4 = 0; uVar4 != 8; uVar4 = uVar4 + 1) {
        *(uint *)(lVar1 + uVar4 * 4) = (uVar4 < 4) - 1 ^ alphaBase[lVar2 + -0x10][~(uint)uVar4 & 3];
      }
      lVar1 = lVar1 + 0x20;
    }
    paiVar3 = alphaTable;
    for (uVar4 = 0; uVar4 != 0x100; uVar4 = uVar4 + 1) {
      for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
        (*paiVar3)[lVar2] =
             *(int *)((ulong)(((uint)uVar4 & 0xf) << 5) + 0x360110 + lVar2 * 4) *
             ((uint)(uVar4 >> 4) & 0xfffffff);
      }
      paiVar3 = paiVar3 + 1;
    }
  }
  return;
}

Assistant:

void setupAlphaTable() 
{
  if(alphaTableInitialized)
    return;
  alphaTableInitialized = 1;

	//read table used for alpha compression
	int buf;
	for(int i = 16; i<32; i++) 
	{
		for(int j=0; j<8; j++) 
		{
			buf=alphaBase[i-16][3-j%4];
			if(j<4)
				alphaTable[i][j]=buf;
			else
				alphaTable[i][j]=(-buf-1);
		}
	}
	
	//beyond the first 16 values, the rest of the table is implicit.. so calculate that!
	for(int i=0; i<256; i++) 
	{
		//fill remaining slots in table with multiples of the first ones.
		int mul = i/16;
		int old = 16+i%16;
		for(int j = 0; j<8; j++) 
		{
			alphaTable[i][j]=alphaTable[old][j]*mul;
			//note: we don't do clamping here, though we could, because we'll be clamped afterwards anyway.
		}
	}
}